

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Value * duckdb::Value::MAP(Value *__return_storage_ptr__,LogicalType *child_type,
                          vector<duckdb::Value,_true> *values)

{
  pointer pVVar1;
  Value *pVVar2;
  Value *pVVar3;
  Value *pVVar4;
  vector<duckdb::Value,_true> *this;
  const_reference pvVar5;
  LogicalType *key_type;
  LogicalType *pLVar6;
  Value *pVVar7;
  Value *val;
  pointer pVVar8;
  vector<duckdb::Value,_true> map_values;
  vector<duckdb::Value,_true> map_keys;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  unique_keys;
  Value *local_f8;
  Value *pVStack_f0;
  pointer local_e8;
  Value *local_d8;
  Value *pVStack_d0;
  pointer local_c8;
  vector<duckdb::Value,_true> local_b8;
  vector<duckdb::Value,_true> local_98;
  Value *local_78;
  LogicalType *local_70;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_c8 = (pointer)0x0;
  local_d8 = (Value *)0x0;
  pVStack_d0 = (Value *)0x0;
  local_e8 = (pointer)0x0;
  local_f8 = (Value *)0x0;
  pVStack_f0 = (Value *)0x0;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  pVVar8 = (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar1 = (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_78 = __return_storage_ptr__;
  local_70 = child_type;
  if (pVVar8 != pVVar1) {
    do {
      this = StructValue::GetChildren(pVVar8);
      pvVar5 = vector<duckdb::Value,_true>::operator[](this,0);
      MapKeyCheck((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&local_68,pvVar5);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_d8,pvVar5);
      pvVar5 = vector<duckdb::Value,_true>::operator[](this,1);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_f8,pvVar5);
      pVVar8 = pVVar8 + 1;
    } while (pVVar8 != pVVar1);
  }
  pLVar6 = local_70;
  key_type = StructType::GetChildType(local_70,0);
  pLVar6 = StructType::GetChildType(pLVar6,1);
  pVVar4 = local_78;
  local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_d8;
  local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_d0;
  local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_c8;
  local_d8 = (Value *)0x0;
  pVStack_d0 = (Value *)0x0;
  local_c8 = (pointer)0x0;
  local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = local_f8;
  local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVStack_f0;
  local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_e8;
  local_f8 = (Value *)0x0;
  pVStack_f0 = (Value *)0x0;
  local_e8 = (pointer)0x0;
  MAP(local_78,key_type,pLVar6,&local_98,&local_b8);
  pVVar8 = local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pVVar7 = local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_start; pVVar7 != pVVar8; pVVar7 = pVVar7 + 1) {
    ~Value(pVVar7);
  }
  pVVar7 = local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar2 = local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start != (Value *)0x0) {
    operator_delete(local_b8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_start);
    pVVar7 = local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_start;
    pVVar2 = local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  for (; pVVar8 = local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                  super__Vector_impl_data._M_finish,
      pVVar7 != local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                super__Vector_impl_data._M_finish; pVVar7 = pVVar7 + 1) {
    local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar2;
    ~Value(pVVar7);
    pVVar2 = local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
             super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar8;
  }
  local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = pVVar2;
  if (local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start != (Value *)0x0) {
    operator_delete(local_98.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  pVVar2 = pVStack_f0;
  for (pVVar7 = local_f8; pVVar7 != pVVar2; pVVar7 = pVVar7 + 1) {
    ~Value(pVVar7);
  }
  pVVar7 = local_d8;
  pVVar2 = pVStack_d0;
  if (local_f8 != (Value *)0x0) {
    operator_delete(local_f8);
    pVVar7 = local_d8;
    pVVar2 = pVStack_d0;
  }
  for (; pVVar3 = pVStack_d0, pVVar7 != pVStack_d0; pVVar7 = pVVar7 + 1) {
    pVStack_d0 = pVVar2;
    ~Value(pVVar7);
    pVVar2 = pVStack_d0;
    pVStack_d0 = pVVar3;
  }
  if (local_d8 != (Value *)0x0) {
    pVStack_d0 = pVVar2;
    operator_delete(local_d8);
  }
  return pVVar4;
}

Assistant:

Value Value::MAP(const LogicalType &child_type, vector<Value> values) { // NOLINT
	vector<Value> map_keys;
	vector<Value> map_values;
	unordered_set<hash_t> unique_keys;

	for (auto &val : values) {
		D_ASSERT(val.type().InternalType() == PhysicalType::STRUCT);
		auto &children = StructValue::GetChildren(val);
		D_ASSERT(children.size() == 2);

		auto &key = children[0];
		MapKeyCheck(unique_keys, key);

		map_keys.push_back(key);
		map_values.push_back(children[1]);
	}

	auto &key_type = StructType::GetChildType(child_type, 0);
	auto &value_type = StructType::GetChildType(child_type, 1);
	return Value::MAP(key_type, value_type, std::move(map_keys), std::move(map_values));
}